

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O3

bool __thiscall
bloaty::RangeMap::
TranslateAndTrimRangeWithEntry<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
          (RangeMap *this,
          _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter,
          uint64_t addr,uint64_t size,uint64_t *trimmed_addr,uint64_t *translated_addr,
          uint64_t *trimmed_size)

{
  uint64_t uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (addr < *(ulong *)(iter._M_node + 1)) {
    addr = *(ulong *)(iter._M_node + 1);
  }
  *trimmed_addr = addr;
  if (size == 0xffffffffffffffff) {
    *trimmed_size = 0xffffffffffffffff;
  }
  else {
    uVar2 = (long)&(iter._M_node[2]._M_parent)->_M_color + *(long *)(iter._M_node + 1);
    if (size + addr <= uVar2) {
      uVar2 = size + addr;
    }
    uVar1 = 0;
    if (addr <= uVar2) {
      uVar1 = uVar2 - addr;
    }
    *trimmed_size = uVar1;
    if (addr > uVar2 || uVar2 - addr == 0) {
      return false;
    }
  }
  bVar3 = iter._M_node[2]._M_left != (_Base_ptr)0xffffffffffffffff;
  if (bVar3) {
    uVar1 = TranslateWithEntry<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      (this,iter,addr);
    *translated_addr = uVar1;
  }
  return bVar3;
}

Assistant:

bool RangeMap::TranslateAndTrimRangeWithEntry(T iter, uint64_t addr,
                                              uint64_t size, uint64_t* trimmed_addr,
                                              uint64_t* translated_addr,
                                              uint64_t* trimmed_size) const {
  addr = std::max(addr, iter->first);
  *trimmed_addr = addr;

  if (size == kUnknownSize) {
    *trimmed_size = kUnknownSize;
  } else {
    uint64_t end = std::min(addr + size, iter->first + iter->second.size);
    if (addr >= end) {
      *trimmed_size = 0;
      return false;
    }
    *trimmed_size = end - addr;
  }

  if (!iter->second.HasTranslation()) {
    return false;
  }

  *translated_addr = TranslateWithEntry(iter, addr);
  return true;
}